

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bounding_box.cpp
# Opt level: O3

bool ON_GetPointListBoundingBox
               (int dim,bool is_rat,int count,int stride,double *points,ON_BoundingBox *tight_bbox,
               int bGrowBox,ON_Xform *xform)

{
  double *pdVar1;
  byte bVar2;
  ON_3dPoint *pOVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  bool bVar8;
  long lVar9;
  double *pdVar10;
  int iVar11;
  int iVar12;
  ON_Xform *xform_00;
  double dVar13;
  double local_c8;
  double local_c0;
  double local_b8;
  ON_BoundingBox local_a8;
  ON_3dPoint local_78;
  double local_60;
  double local_58;
  double local_50;
  ulong local_48;
  double local_40;
  ON_BoundingBox *local_38;
  
  if (bGrowBox != 0) {
    bVar8 = ON_BoundingBox::IsNotEmpty(tight_bbox);
    bVar2 = 1;
    if (bVar8) goto LAB_003e0542;
  }
  dVar6 = ON_BoundingBox::EmptyBoundingBox.m_max.z;
  dVar5 = ON_BoundingBox::EmptyBoundingBox.m_max.x;
  dVar4 = ON_BoundingBox::EmptyBoundingBox.m_min.z;
  dVar7 = ON_BoundingBox::EmptyBoundingBox.m_min.y;
  dVar13 = ON_BoundingBox::EmptyBoundingBox.m_min.x;
  (tight_bbox->m_max).y = ON_BoundingBox::EmptyBoundingBox.m_max.y;
  (tight_bbox->m_max).z = dVar6;
  (tight_bbox->m_min).z = dVar4;
  (tight_bbox->m_max).x = dVar5;
  (tight_bbox->m_min).x = dVar13;
  (tight_bbox->m_min).y = dVar7;
  bVar2 = 0;
LAB_003e0542:
  if ((points == (double *)0x0 || (dim < 1 || count < 1)) ||
     ((count != 1 && (stride < (int)((uint)is_rat + dim))))) {
    bVar8 = (bool)(bVar2 & count == 0);
  }
  else {
    local_38 = tight_bbox;
    ON_BoundingBox::ON_BoundingBox(&local_a8);
    ON_3dPoint::ON_3dPoint(&local_78,0.0,0.0,0.0);
    if (xform == (ON_Xform *)0x0) {
      xform_00 = (ON_Xform *)0x0;
    }
    else {
      bVar8 = ON_Xform::IsIdentity(xform,0.0);
      xform_00 = (ON_Xform *)0x0;
      if (!bVar8) {
        xform_00 = xform;
      }
    }
    iVar11 = 3;
    if ((uint)dim < 3) {
      iVar11 = dim;
    }
    lVar9 = (long)stride;
    if (is_rat) {
      pdVar10 = points + (uint)dim;
      dVar13 = *pdVar10;
      while ((dVar13 == 0.0 && (!NAN(dVar13)))) {
        if (count < 2) {
          return false;
        }
        count = count - 1;
        pdVar1 = (double *)((long)points + (lVar9 + (ulong)(uint)dim) * 8);
        points = (double *)((long)points + lVar9 * 8);
        dVar13 = *pdVar1;
      }
      bVar8 = *pdVar10 != 0.0;
      local_48 = (ulong)(uint)(iVar11 * 8);
      memcpy(&local_a8,points,local_48);
      dVar13 = 1.0 / dVar13;
      local_a8.m_min.x = dVar13 * local_a8.m_min.x;
      local_a8.m_min.y = dVar13 * local_a8.m_min.y;
      local_a8.m_min.z = dVar13 * local_a8.m_min.z;
    }
    else {
      local_48 = (ulong)(uint)(iVar11 * 8);
      memcpy(&local_a8,points,local_48);
      bVar8 = true;
    }
    if (xform_00 != (ON_Xform *)0x0) {
      ON_3dPoint::Transform(&local_a8.m_min,xform_00);
    }
    local_a8.m_max.z = local_a8.m_min.z;
    local_a8.m_max.x = local_a8.m_min.x;
    local_a8.m_max.y = local_a8.m_min.y;
    if (1 < (uint)count) {
      pdVar10 = points + lVar9;
      if (is_rat) {
        if (xform_00 == (ON_Xform *)0x0) {
          local_40 = local_a8.m_min.x;
          local_50 = local_a8.m_min.x;
          local_58 = local_a8.m_min.y;
          local_c8 = local_a8.m_min.y;
          local_60 = local_a8.m_min.z;
          local_c0 = local_a8.m_min.z;
          iVar11 = count - 1;
          do {
            dVar13 = pdVar10[(uint)dim];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              memcpy(&local_78,pdVar10,local_48);
              dVar13 = 1.0 / dVar13;
              local_78.x = dVar13 * local_78.x;
              local_78.y = dVar13 * local_78.y;
              local_78.z = dVar13 * local_78.z;
              dVar13 = local_78.x;
              dVar7 = local_78.x;
              if ((local_50 <= local_78.x) &&
                 (dVar13 = local_a8.m_min.x, dVar7 = local_50, local_40 < local_78.x)) {
                local_a8.m_max.x = local_78.x;
                local_40 = local_78.x;
              }
              local_50 = dVar7;
              local_a8.m_min.x = dVar13;
              if (local_58 <= local_78.y) {
                pOVar3 = &local_a8.m_max;
                dVar13 = local_78.y;
                if (local_c8 < local_78.y) goto LAB_003e0a83;
              }
              else {
                pOVar3 = &local_a8.m_min;
                dVar13 = local_c8;
                local_58 = local_78.y;
LAB_003e0a83:
                pOVar3->y = local_78.y;
                local_c8 = dVar13;
              }
              if (local_60 <= local_78.z) {
                dVar13 = local_78.z;
                pOVar3 = &local_a8.m_max;
                if (local_78.z <= local_c0) goto LAB_003e0ac8;
              }
              else {
                dVar13 = local_c0;
                local_60 = local_78.z;
                pOVar3 = &local_a8.m_min;
              }
              pOVar3->z = local_78.z;
              local_c0 = dVar13;
            }
            else {
              bVar8 = false;
            }
LAB_003e0ac8:
            pdVar10 = pdVar10 + lVar9;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
        else {
          iVar12 = count - 1;
          do {
            dVar13 = pdVar10[(uint)dim];
            if ((dVar13 != 0.0) || (NAN(dVar13))) {
              memcpy(&local_78,pdVar10,local_48);
              dVar13 = 1.0 / dVar13;
              local_78.x = dVar13 * local_78.x;
              local_78.y = dVar13 * local_78.y;
              local_78.z = dVar13 * local_78.z;
              ON_3dPoint::Transform(&local_78,xform_00);
              if (local_a8.m_min.x <= local_78.x) {
                if (local_a8.m_max.x < local_78.x) {
                  local_a8.m_max.x = local_78.x;
                }
              }
              else {
                local_a8.m_min.x = local_78.x;
              }
              pOVar3 = &local_a8.m_min;
              if ((local_78.y < local_a8.m_min.y) ||
                 (pOVar3 = &local_a8.m_max, local_a8.m_max.y < local_78.y)) {
                pOVar3->y = local_78.y;
              }
              pOVar3 = &local_a8.m_min;
              if ((local_78.z < local_a8.m_min.z) ||
                 (pOVar3 = &local_a8.m_max, local_a8.m_max.z < local_78.z)) {
                pOVar3->z = local_78.z;
              }
            }
            else {
              bVar8 = false;
            }
            pdVar10 = pdVar10 + lVar9;
            iVar12 = iVar12 + -1;
          } while (iVar12 != 0);
          if ((uint)dim < 3) {
            do {
              pdVar10 = ON_3dPoint::operator[](&local_a8.m_min,iVar11);
              *pdVar10 = 0.0;
              pdVar10 = ON_3dPoint::operator[](&local_a8.m_max,iVar11);
              *pdVar10 = 0.0;
              iVar11 = iVar11 + 1;
            } while (iVar11 != 3);
          }
        }
      }
      else if (xform_00 == (ON_Xform *)0x0) {
        local_60 = local_a8.m_min.x;
        local_c0 = local_a8.m_min.x;
        local_50 = local_a8.m_min.y;
        local_b8 = local_a8.m_min.y;
        local_58 = local_a8.m_min.z;
        local_c8 = local_a8.m_min.z;
        iVar11 = count - 1;
        do {
          memcpy(&local_78,pdVar10,local_48);
          if (local_c0 <= local_78.x) {
            if (local_60 < local_78.x) {
              local_a8.m_max.x = local_78.x;
              local_60 = local_78.x;
            }
          }
          else {
            local_a8.m_min.x = local_78.x;
            local_c0 = local_78.x;
          }
          if (local_50 <= local_78.y) {
            pOVar3 = &local_a8.m_max;
            dVar13 = local_78.y;
            if (local_b8 < local_78.y) goto LAB_003e0bb2;
          }
          else {
            local_50 = local_78.y;
            dVar13 = local_b8;
            pOVar3 = &local_a8.m_min;
LAB_003e0bb2:
            pOVar3->y = local_78.y;
            local_b8 = dVar13;
          }
          if (local_58 <= local_78.z) {
            dVar13 = local_78.z;
            pOVar3 = &local_a8.m_max;
            if (local_c8 < local_78.z) goto LAB_003e0bee;
          }
          else {
            local_58 = local_78.z;
            dVar13 = local_c8;
            pOVar3 = &local_a8.m_min;
LAB_003e0bee:
            pOVar3->z = local_78.z;
            local_c8 = dVar13;
          }
          pdVar10 = pdVar10 + lVar9;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
      }
      else {
        iVar12 = count - 1;
        do {
          memcpy(&local_78,pdVar10,local_48);
          ON_3dPoint::Transform(&local_78,xform_00);
          if (local_a8.m_min.x <= local_78.x) {
            if (local_a8.m_max.x < local_78.x) {
              local_a8.m_max.x = local_78.x;
            }
          }
          else {
            local_a8.m_min.x = local_78.x;
          }
          pOVar3 = &local_a8.m_min;
          if ((local_78.y < local_a8.m_min.y) ||
             (pOVar3 = &local_a8.m_max, local_a8.m_max.y < local_78.y)) {
            pOVar3->y = local_78.y;
          }
          pOVar3 = &local_a8.m_min;
          if ((local_78.z < local_a8.m_min.z) ||
             (pOVar3 = &local_a8.m_max, local_a8.m_max.z < local_78.z)) {
            pOVar3->z = local_78.z;
          }
          pdVar10 = pdVar10 + lVar9;
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
        if ((uint)dim < 3) {
          do {
            pdVar10 = ON_3dPoint::operator[](&local_a8.m_min,iVar11);
            *pdVar10 = 0.0;
            pdVar10 = ON_3dPoint::operator[](&local_a8.m_max,iVar11);
            *pdVar10 = 0.0;
            iVar11 = iVar11 + 1;
          } while (iVar11 != 3);
        }
      }
    }
    ON_BoundingBox::Union(local_38,&local_a8);
  }
  return bVar8;
}

Assistant:

bool ON_GetPointListBoundingBox( 
    int dim, bool is_rat, int count, int stride, const double* points, 
    ON_BoundingBox& tight_bbox,
    int bGrowBox,
    const ON_Xform* xform
    )
{
  // bounding box workhorse
  bool rc = false;
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  if ( is_rat )
  {
    is_rat = 1;
  }

  if ( count > 0 && dim > 0 && points && (count == 1 || stride >= dim+is_rat) ) 
  {
    ON_BoundingBox bbox;
    ON_3dPoint P(0.0,0.0,0.0);
    double w;
    int i, wi;

    if ( xform && xform->IsIdentity() )
    {
      xform = 0;
    }
    wi = dim;
    if ( dim > 3 )
    {
      dim = 3;
    }

    rc = true;
    if ( is_rat ) 
    {
      // skip bogus starting points
      while ( count > 0 && points[wi] == 0.0 ) 
      {
        count--;
        points += stride;
        rc = false;
      }
      if ( count <= 0 )
        return false;
    }

    memcpy( &bbox.m_min.x, points, dim*sizeof(bbox.m_min.x) );
    if ( is_rat )
    {
      w = 1.0/points[wi];
      bbox.m_min.x *= w; bbox.m_min.y *= w; bbox.m_min.z *= w;
    }
    if ( xform )
    {
      bbox.m_min.Transform(*xform);
    }
    bbox.m_max = bbox.m_min;
    points += stride;
    count--;

    if ( count > 0 ) 
    {
      if ( is_rat )
      {
        // homogeneous rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            if ( 0.0 == (w = points[wi]) ) 
            {
              rc = false;
              continue;
            }
            memcpy( &P.x, points, dim*sizeof(P.x) );
            w = 1.0/w;
            P.x *= w; P.y *= w; P.z *= w;
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
      else 
      {
        // bounding box of non-rational points
        if ( xform )
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            P.Transform(*xform);
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
          if ( dim < 3 )
          {
            for ( i = dim; i < 3; i++)
            {
              bbox.m_min[i] = 0.0;
              bbox.m_max[i] = 0.0;
            }
          }
        }
        else
        {
          for ( /*empty*/; count--; points += stride ) 
          {
            memcpy( &P.x, points, dim*sizeof(P.x) );
            if ( bbox.m_min.x > P.x ) bbox.m_min.x = P.x; else if ( bbox.m_max.x < P.x ) bbox.m_max.x = P.x;
            if ( bbox.m_min.y > P.y ) bbox.m_min.y = P.y; else if ( bbox.m_max.y < P.y ) bbox.m_max.y = P.y;
            if ( bbox.m_min.z > P.z ) bbox.m_min.z = P.z; else if ( bbox.m_max.z < P.z ) bbox.m_max.z = P.z;
          }
        }
      }
    }

    tight_bbox.Union(bbox);
  }
  else if ( bGrowBox ) 
  {
    // result is still valid if no points are added to a valid input box
    rc = (0 == count);
  }

  return rc;
}